

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O2

void __thiscall
Amiga::Chipset::CIABHandler::set_port_output(CIABHandler *this,Port port,uint8_t value)

{
  if (port != A) {
    DiskController::set_mtr_sel_side_dir_step(this->controller_,value);
    return;
  }
  return;
}

Assistant:

void Chipset::CIABHandler::set_port_output(MOS::MOS6526::Port port, uint8_t value) {
	if(port) {
		// CIA B, Port B:
		//
		// Disk motor control, drive and head selection,
		// and stepper control:
		controller_.set_mtr_sel_side_dir_step(value);
	} else {
		// CIA B, Port A: Serial port control.
		//
		// b7: /DTR
		// b6: /RTS
		// b5: /CD
		// b4: /CTS
		// b3: /DSR
		// b2: SEL
		// b1: POUT
		// b0: BUSY
		logger.error().append("TODO: DTR/RTS/etc: %02x", value);
	}
}